

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXTokenizer.cpp
# Opt level: O1

void Assimp::FBX::anon_unknown_3::ProcessDataToken
               (TokenList *output_tokens,char **start,char **end,uint line,uint column,
               TokenType type,bool must_have_token)

{
  pointer *pppTVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  iterator __position;
  bool bVar5;
  char *pcVar6;
  anon_union_8_2_0c989700_for_Token_4 aVar7;
  string local_50;
  
  pcVar3 = *start;
  pcVar4 = *end;
  if (pcVar4 == (char *)0x0 || pcVar3 == (char *)0x0) {
    if (must_have_token) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"unexpected character, expected data token","");
      TokenizeError(&local_50,line,column);
    }
  }
  else {
    if (pcVar3 != pcVar4 + 1) {
      pcVar6 = pcVar3 + -1;
      bVar5 = false;
      do {
        bVar2 = pcVar6[1];
        bVar5 = (bool)(bVar2 == 0x22 ^ bVar5);
        if (((!bVar5) && (bVar2 < 0x21)) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"unexpected whitespace in token","");
          TokenizeError(&local_50,line,column);
        }
        pcVar6 = pcVar6 + 1;
      } while (pcVar6 != pcVar4);
      if (bVar5) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"non-terminated double quotes","");
        TokenizeError(&local_50,line,column);
      }
    }
    local_50._M_dataplus._M_p = (pointer)operator_new(0x28);
    ((Token *)local_50._M_dataplus._M_p)->sbegin = pcVar3;
    ((Token *)local_50._M_dataplus._M_p)->send = pcVar4 + 1;
    ((Token *)local_50._M_dataplus._M_p)->type = type;
    aVar7.line._4_4_ = 0;
    aVar7.line._0_4_ = line;
    ((Token *)local_50._M_dataplus._M_p)->field_3 = aVar7;
    ((Token *)local_50._M_dataplus._M_p)->column = column;
    __position._M_current =
         (output_tokens->
         super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (output_tokens->
        super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>)
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
      _M_realloc_insert<Assimp::FBX::Token_const*>
                ((vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *)
                 output_tokens,__position,(Token **)&local_50);
    }
    else {
      *__position._M_current = (Token *)local_50._M_dataplus._M_p;
      pppTVar1 = &(output_tokens->
                  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
  }
  *end = (char *)0x0;
  *start = (char *)0x0;
  return;
}

Assistant:

void ProcessDataToken( TokenList& output_tokens, const char*& start, const char*& end,
                      unsigned int line,
                      unsigned int column,
                      TokenType type = TokenType_DATA,
                      bool must_have_token = false)
{
    if (start && end) {
        // sanity check:
        // tokens should have no whitespace outside quoted text and [start,end] should
        // properly delimit the valid range.
        bool in_double_quotes = false;
        for (const char* c = start; c != end + 1; ++c) {
            if (*c == '\"') {
                in_double_quotes = !in_double_quotes;
            }

            if (!in_double_quotes && IsSpaceOrNewLine(*c)) {
                TokenizeError("unexpected whitespace in token", line, column);
            }
        }

        if (in_double_quotes) {
            TokenizeError("non-terminated double quotes", line, column);
        }

        output_tokens.push_back(new_Token(start,end + 1,type,line,column));
    }
    else if (must_have_token) {
        TokenizeError("unexpected character, expected data token", line, column);
    }

    start = end = NULL;
}